

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O3

ly_bool tro_read_if_sibling_exists(trt_tree_ctx *tc)

{
  lysp_node *plVar1;
  
  if (tc->lysc_tree == '\0') {
    plVar1 = tc->pn;
  }
  else {
    plVar1 = (lysp_node *)&tc->cn->parent;
  }
  return (lysc_node *)plVar1->parent != (lysc_node *)0x0;
}

Assistant:

static ly_bool
tro_read_if_sibling_exists(const struct trt_tree_ctx *tc)
{
    const void *parent;

    if (tc->lysc_tree) {
        parent = troc_parent(tc->cn);
    } else {
        parent = trop_parent(tc->pn);
    }

    return parent ? 1 : 0;
}